

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  byte *pbVar6;
  ValueHolder VVar7;
  ValueType type;
  ulong uVar8;
  ValueHolder local_58 [2];
  undefined8 local_48;
  
  cVar1 = *token->start_;
  uVar8 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  pbVar6 = (byte *)(token->start_ + (cVar1 == '-'));
  bVar4 = false;
  VVar7.int_ = 0;
  while (pbVar6 < token->end_) {
    bVar2 = *pbVar6;
    pbVar6 = pbVar6 + 1;
    if (((byte)(bVar2 - 0x3a) < 0xf6) ||
       ((uVar5 = (ulong)(bVar2 - 0x30), uVar8 / 10 <= VVar7.uint_ &&
        (((uVar8 / 10 < VVar7.uint_ || (pbVar6 != (byte *)token->end_)) || (uVar8 % 10 < uVar5))))))
    {
      bVar4 = decodeDouble(this,token,decoded);
      bVar3 = false;
    }
    else {
      VVar7.string_ = (char *)(uVar5 + VVar7.int_ * 10);
      bVar3 = true;
    }
    if (!bVar3) {
      return bVar4;
    }
  }
  if ((cVar1 == '-') && (VVar7.int_ == uVar8)) {
    local_48 = 0;
    Value::initBasic((Value *)local_58,intValue,false);
    local_58[0].int_ = 0x8000000000000000;
    goto LAB_00109356;
  }
  if (cVar1 == '-') {
    VVar7.int_ = -VVar7.int_;
LAB_00109320:
    type = intValue;
  }
  else {
    if (VVar7.uint_ < 0x80000000) goto LAB_00109320;
    type = uintValue;
  }
  local_48 = 0;
  Value::initBasic((Value *)local_58,type,false);
  local_58[0] = VVar7;
LAB_00109356:
  Value::swap((Value *)local_58,decoded);
  Value::~Value((Value *)local_58);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  // TODO: Help the compiler do the div and mod at compile time or get rid of
  // them.
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(Value::maxLargestInt) + 1
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return decodeDouble(token, decoded);
    auto digit(static_cast<Value::UInt>(c - '0'));
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative && value == maxIntegerValue)
    decoded = Value::minLargestInt;
  else if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}